

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

ssize_t Curl_conn_send(Curl_easy *data,int num,void *mem,size_t len,CURLcode *code)

{
  ssize_t sVar1;
  Curl_cfilter *pCVar2;
  
  pCVar2 = data->conn->cfilter[num];
  while( true ) {
    if (pCVar2 == (Curl_cfilter *)0x0) {
      Curl_failf(data,"send: no filter connected");
      *code = CURLE_FAILED_INIT;
      return -1;
    }
    if ((pCVar2->field_0x24 & 1) != 0) break;
    pCVar2 = pCVar2->next;
  }
  sVar1 = (*pCVar2->cft->do_send)(pCVar2,data,mem,len,code);
  return sVar1;
}

Assistant:

ssize_t Curl_conn_send(struct Curl_easy *data, int num,
                       const void *mem, size_t len, CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->do_send(cf, data, mem, len, code);
  }
  failf(data, "send: no filter connected");
  DEBUGASSERT(0);
  *code = CURLE_FAILED_INIT;
  return -1;
}